

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

BackwardMatch * __thiscall
brotli::HashToBinaryTree::StoreAndFindMatches
          (HashToBinaryTree *this,uint8_t *data,size_t cur_ix,size_t ring_buffer_mask,
          size_t max_length,size_t *best_len,BackwardMatch *matches)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  BackwardMatch *local_a0;
  long local_90;
  long local_88;
  ulong local_58;
  uint local_48;
  
  uVar10 = ring_buffer_mask & cur_ix;
  uVar13 = this->window_mask_;
  uVar2 = (uint)(*(int *)(data + uVar10) * 0x1e35a7bd) >> 0xf;
  uVar9 = uVar13 & cur_ix;
  uVar6 = this->buckets_[uVar2];
  uVar1 = max_length;
  if (0x7f < max_length) {
    this->buckets_[uVar2] = (uint32_t)cur_ix;
    uVar1 = 0x80;
  }
  local_a0 = matches;
  local_88 = uVar9 * 2 + 1;
  local_90 = uVar9 * 2;
  lVar5 = -0x40;
  uVar9 = 0;
  local_58 = 0;
  do {
    uVar11 = cur_ix - uVar6;
    if (((uVar11 == 0) || (uVar13 - 0xf < uVar11)) || (lVar5 == 0)) {
      if (0x7f < max_length) {
        uVar7 = this->invalid_pos_;
        puVar8 = this->forest_;
        puVar8[local_90] = uVar7;
LAB_001698bf:
        puVar8[local_88] = uVar7;
      }
      return local_a0;
    }
    local_48 = (uint)ring_buffer_mask;
    uVar4 = local_58;
    if (uVar9 < local_58) {
      uVar4 = uVar9;
    }
    sVar3 = FindMatchLengthWithLimit
                      (data + uVar4 + uVar10,data + uVar4 + (uVar6 & local_48),max_length - uVar4);
    uVar4 = sVar3 + uVar4;
    if (*best_len < uVar4) {
      *best_len = uVar4;
      if (local_a0 == (BackwardMatch *)0x0) {
        local_a0 = (BackwardMatch *)0x0;
      }
      else {
        *local_a0 = (BackwardMatch)(uVar11 & 0xffffffff | uVar4 << 0x25);
        local_a0 = local_a0 + 1;
      }
      if (uVar1 <= uVar4) {
        if (max_length < 0x80) {
          return local_a0;
        }
        uVar13 = (ulong)(uVar6 & (uint)this->window_mask_);
        puVar8 = this->forest_;
        puVar8[local_90] = puVar8[uVar13 * 2];
        uVar7 = puVar8[uVar13 * 2 + 1];
        goto LAB_001698bf;
      }
    }
    puVar8 = this->forest_;
    if (data[uVar4 + (uVar6 & local_48)] < data[uVar4 + uVar10]) {
      if (0x7f < max_length) {
        puVar8[local_90] = uVar6;
      }
      lVar12 = (ulong)(uVar6 & (uint)this->window_mask_) * 2 + 1;
      local_90 = lVar12;
      local_58 = uVar4;
    }
    else {
      if (0x7f < max_length) {
        puVar8[local_88] = uVar6;
      }
      lVar12 = (ulong)(uVar6 & (uint)this->window_mask_) * 2;
      uVar9 = uVar4;
      local_88 = lVar12;
    }
    uVar6 = puVar8[lVar12];
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

BackwardMatch* StoreAndFindMatches(const uint8_t* const __restrict data,
                                     const size_t cur_ix,
                                     const size_t ring_buffer_mask,
                                     const size_t max_length,
                                     size_t* const __restrict best_len,
                                     BackwardMatch* __restrict matches) {
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const size_t max_backward = window_mask_ - 15;
    const size_t max_comp_len = std::min(max_length, kMaxTreeCompLength);
    const bool reroot_tree = max_length >= kMaxTreeCompLength;
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    size_t prev_ix = buckets_[key];
    // The forest index of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_left = LeftChildIndex(cur_ix);
    // The forest index of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_right = RightChildIndex(cur_ix);
    // The match length of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_left = 0;
    // The match length of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_right = 0;
    if (reroot_tree) {
      buckets_[key] = static_cast<uint32_t>(cur_ix);
    }
    for (size_t depth_remaining = kMaxTreeSearchDepth; ; --depth_remaining) {
      const size_t backward = cur_ix - prev_ix;
      const size_t prev_ix_masked = prev_ix & ring_buffer_mask;
      if (backward == 0 || backward > max_backward || depth_remaining == 0) {
        if (reroot_tree) {
          forest_[node_left] = invalid_pos_;
          forest_[node_right] = invalid_pos_;
        }
        break;
      }
      const size_t cur_len = std::min(best_len_left, best_len_right);
      const size_t len = cur_len +
          FindMatchLengthWithLimit(&data[cur_ix_masked + cur_len],
                                   &data[prev_ix_masked + cur_len],
                                   max_length - cur_len);
      if (len > *best_len) {
        *best_len = len;
        if (matches) {
          *matches++ = BackwardMatch(backward, len);
        }
        if (len >= max_comp_len) {
          if (reroot_tree) {
            forest_[node_left] = forest_[LeftChildIndex(prev_ix)];
            forest_[node_right] = forest_[RightChildIndex(prev_ix)];
          }
          break;
        }
      }
      if (data[cur_ix_masked + len] > data[prev_ix_masked + len]) {
        best_len_left = len;
        if (reroot_tree) {
          forest_[node_left] = static_cast<uint32_t>(prev_ix);
        }
        node_left = RightChildIndex(prev_ix);
        prev_ix = forest_[node_left];
      } else {
        best_len_right = len;
        if (reroot_tree) {
          forest_[node_right] = static_cast<uint32_t>(prev_ix);
        }
        node_right = LeftChildIndex(prev_ix);
        prev_ix = forest_[node_right];
      }
    }
    return matches;
  }